

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op<std::plus<float>>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  float fVar4;
  int i_14;
  int i_13;
  float b0_6;
  int x_3;
  float a0_6;
  int y_3;
  float *outptr_12;
  float *ptr1_8;
  int i_12;
  float *outptr_11;
  float *ptr1_7;
  float a0_5;
  int q_10;
  int i_11;
  float a0_4;
  int i_10;
  float a0_3;
  int i_9;
  float *outptr_10;
  float *ptr1_6;
  int q_9;
  float a0_2;
  int x_2;
  float b0_5;
  int y_2;
  float *outptr_9;
  float *ptr_8;
  int i_8;
  float b0_4;
  int i_7;
  int x_1;
  float a0_1;
  int y_1;
  float *outptr_8;
  float *ptr1_5;
  float *ptr_7;
  int q_8;
  int i_6;
  float *outptr_7;
  float b0_3;
  float *ptr_6;
  int q_7;
  int i_5;
  float *outptr_6;
  float *ptr_5;
  int q_6;
  float b0_2;
  int x;
  float b0_1;
  int y;
  float *outptr_5;
  float *ptr1_4;
  float *ptr_4;
  int q_5;
  int i_4;
  float *outptr_4;
  float *ptr1_3;
  float *ptr_3;
  int q_4;
  int i_3;
  float *outptr_3;
  float *ptr1_2;
  float *ptr_2;
  int q_3;
  int i_2;
  float *outptr_2;
  float *ptr1_1;
  float *a0;
  int q_2;
  int i_1;
  float *outptr_1;
  float *ptr1;
  float *ptr_1;
  int q_1;
  int i;
  float *outptr;
  float *b0;
  float *ptr;
  int q;
  int size1;
  int channels1;
  int h1;
  int w1;
  size_t elemsize;
  int size;
  int channels;
  int h;
  int w;
  plus<float> op;
  Mat *in_stack_fffffffffffff5c0;
  undefined4 in_stack_fffffffffffff5c8;
  undefined4 in_stack_fffffffffffff5cc;
  size_t in_stack_fffffffffffff5d0;
  int _c;
  Mat *pMVar5;
  int _h;
  undefined8 in_stack_fffffffffffff5d8;
  int _w;
  Mat *in_stack_fffffffffffff5e0;
  int local_880;
  int local_87c;
  float local_878;
  int local_874;
  float local_870;
  int local_86c;
  float *local_868;
  float *local_860;
  int local_854;
  Mat local_850;
  float *local_810;
  Mat local_808;
  float *local_7c8;
  float local_7bc;
  int local_7b8;
  int local_7b4;
  float local_7b0;
  int local_7ac;
  float local_7a8;
  int local_7a4;
  Mat local_7a0;
  float *local_760;
  Mat local_758;
  float *local_718;
  int local_70c;
  float local_708;
  int local_704;
  float local_700;
  int local_6fc;
  float *local_6f8;
  float *local_6f0;
  int local_6e8;
  float local_6e4;
  int local_6e0;
  int local_6dc;
  float local_6d8;
  int local_6d4;
  Mat local_6d0;
  float *local_690;
  Mat local_688;
  float *local_648;
  float *local_640;
  int local_638;
  int local_634;
  Mat local_630;
  float *local_5f0;
  float local_5e4;
  Mat local_5e0;
  float *local_5a0;
  int local_598;
  int local_594;
  Mat local_590;
  float *local_550;
  Mat local_548;
  float *local_508;
  int local_4fc;
  float local_4f8;
  int local_4f4;
  float local_4f0;
  int local_4ec;
  Mat local_4e8;
  float *local_4a8;
  float *local_4a0;
  Mat local_498;
  float *local_458;
  int local_450;
  int local_44c;
  Mat local_448;
  float *local_408;
  Mat local_400;
  float *local_3c0;
  Mat local_3b8;
  float *local_378;
  int local_370;
  int local_36c;
  Mat local_368;
  float *local_328;
  Mat local_320;
  float *local_2e0;
  float *local_2d8;
  int local_2d0;
  int local_2cc;
  Mat local_2c8;
  float *local_288;
  Mat local_280;
  float *local_240;
  Mat local_238;
  float *local_1f8;
  int local_1f0;
  int local_1ec;
  Mat local_1e8;
  float *local_1a8;
  float *local_1a0;
  Mat local_198;
  float *local_158;
  int local_150;
  int local_14c;
  Mat local_148;
  float *local_108;
  Mat local_100;
  float *local_c0;
  Mat local_a8;
  float *local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  size_t local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  plus<float> local_29 [9];
  Mat *local_20;
  Mat *local_18;
  Mat *local_10;
  
  local_30 = in_RDI->w;
  local_34 = in_RDI->h;
  local_38 = in_RDI->c;
  local_3c = local_30 * local_34;
  local_48 = in_RDI->elemsize;
  local_4c = in_RSI->w;
  local_50 = in_RSI->h;
  local_54 = in_RSI->c;
  local_58 = local_4c * local_50;
  _c = (int)(in_stack_fffffffffffff5d0 >> 0x20);
  _h = (int)in_stack_fffffffffffff5d8;
  _w = (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDI->dims == 3) {
    if (in_RSI->dims == 3) {
      if (((local_4c == 1) && (local_50 == 1)) && (local_54 == local_38)) {
        Mat::create(in_stack_fffffffffffff5e0,_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                    (Allocator *)in_stack_fffffffffffff5c0);
        bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
        if (!bVar1) {
          for (local_5c = 0; local_5c < local_38; local_5c = local_5c + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_a8);
            Mat::~Mat((Mat *)0x18cb77);
            local_68 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_100);
            Mat::~Mat((Mat *)0x18cbcf);
            local_c0 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_148);
            Mat::~Mat((Mat *)0x18cc27);
            local_108 = pfVar2;
            for (local_14c = 0; local_14c < local_3c; local_14c = local_14c + 1) {
              fVar4 = std::plus<float>::operator()(local_29,local_68 + local_14c,local_c0);
              local_108[local_14c] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_4c == local_30) && (local_50 == local_34)) && (local_54 == 1)) {
        Mat::create(in_stack_fffffffffffff5e0,_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                    (Allocator *)in_stack_fffffffffffff5c0);
        bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
        if (!bVar1) {
          for (local_150 = 0; local_150 < local_38; local_150 = local_150 + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_198);
            Mat::~Mat((Mat *)0x18ce3a);
            local_158 = pfVar2;
            local_1a0 = Mat::operator_cast_to_float_(local_18);
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_1e8);
            Mat::~Mat((Mat *)0x18cea7);
            local_1a8 = pfVar2;
            for (local_1ec = 0; local_1ec < local_3c; local_1ec = local_1ec + 1) {
              fVar4 = std::plus<float>::operator()
                                (local_29,local_158 + local_1ec,local_1a0 + local_1ec);
              local_1a8[local_1ec] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_30 == 1) && (local_34 == 1)) && (local_54 == local_38)) {
        Mat::create(in_stack_fffffffffffff5e0,_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                    (Allocator *)in_stack_fffffffffffff5c0);
        bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
        if (!bVar1) {
          for (local_1f0 = 0; local_1f0 < local_54; local_1f0 = local_1f0 + 1) {
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_238);
            Mat::~Mat((Mat *)0x18d09d);
            local_1f8 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_280);
            Mat::~Mat((Mat *)0x18d0f5);
            local_240 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_2c8);
            Mat::~Mat((Mat *)0x18d14d);
            local_288 = pfVar2;
            for (local_2cc = 0; local_2cc < local_58; local_2cc = local_2cc + 1) {
              fVar4 = std::plus<float>::operator()(local_29,local_1f8,local_240 + local_2cc);
              local_288[local_2cc] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (((local_4c == local_30) && (local_50 == local_34)) && (local_38 == 1)) {
        Mat::create(in_stack_fffffffffffff5e0,_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                    (Allocator *)in_stack_fffffffffffff5c0);
        bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
        if (!bVar1) {
          for (local_2d0 = 0; local_2d0 < local_54; local_2d0 = local_2d0 + 1) {
            local_2d8 = Mat::operator_cast_to_float_(local_10);
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_320);
            Mat::~Mat((Mat *)0x18d375);
            local_2e0 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_368);
            Mat::~Mat((Mat *)0x18d3cd);
            local_328 = pfVar2;
            for (local_36c = 0; local_36c < local_58; local_36c = local_36c + 1) {
              fVar4 = std::plus<float>::operator()
                                (local_29,local_2d8 + local_36c,local_2e0 + local_36c);
              local_328[local_36c] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(in_stack_fffffffffffff5e0,_w,_h,_c,
                  CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                  (Allocator *)in_stack_fffffffffffff5c0);
      bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
      if (!bVar1) {
        for (local_370 = 0; local_370 < local_38; local_370 = local_370 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                       (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_3b8);
          Mat::~Mat((Mat *)0x18d593);
          local_378 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                       (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_400);
          Mat::~Mat((Mat *)0x18d5eb);
          local_3c0 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                       (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_448);
          Mat::~Mat((Mat *)0x18d643);
          local_408 = pfVar2;
          for (local_44c = 0; local_44c < local_3c; local_44c = local_44c + 1) {
            fVar4 = std::plus<float>::operator()
                              (local_29,local_378 + local_44c,local_3c0 + local_44c);
            local_408[local_44c] = fVar4;
          }
        }
        return 0;
      }
      return -100;
    }
    Mat::create(in_stack_fffffffffffff5e0,_w,_h,_c,
                CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                (Allocator *)in_stack_fffffffffffff5c0);
    bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
    if (bVar1) {
      return -100;
    }
    if (local_18->dims == 2) {
      for (local_450 = 0; local_450 < local_38; local_450 = local_450 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                     (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_498);
        Mat::~Mat((Mat *)0x18d841);
        local_458 = pfVar2;
        local_4a0 = Mat::row(local_18,local_450);
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                     (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_4e8);
        Mat::~Mat((Mat *)0x18d8b5);
        local_4a8 = pfVar2;
        for (local_4ec = 0; local_4ec < local_34; local_4ec = local_4ec + 1) {
          local_4f0 = local_4a0[local_4ec];
          for (local_4f4 = 0; local_4f4 < local_30; local_4f4 = local_4f4 + 1) {
            fVar4 = std::plus<float>::operator()(local_29,local_458 + local_4f4,&local_4f0);
            local_4a8[local_4f4] = fVar4;
          }
          local_458 = local_458 + local_30;
          local_4a8 = local_4a8 + local_30;
        }
      }
      return 0;
    }
    if (local_18->dims == 1) {
      if (local_18->w == 1) {
        pfVar2 = Mat::operator[](local_18,0);
        local_4f8 = *pfVar2;
        for (local_4fc = 0; local_4fc < local_38; local_4fc = local_4fc + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                       (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_548);
          Mat::~Mat((Mat *)0x18daea);
          local_508 = pfVar2;
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                       (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_590);
          Mat::~Mat((Mat *)0x18db42);
          local_550 = pfVar2;
          for (local_594 = 0; local_594 < local_3c; local_594 = local_594 + 1) {
            fVar4 = std::plus<float>::operator()(local_29,local_508 + local_594,&local_4f8);
            local_550[local_594] = fVar4;
          }
        }
        return 0;
      }
      for (local_598 = 0; local_598 < local_38; local_598 = local_598 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                     (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_5e0);
        Mat::~Mat((Mat *)0x18dca0);
        local_5a0 = pfVar2;
        pfVar2 = Mat::operator[](local_18,(long)local_598);
        local_5e4 = *pfVar2;
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                     (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_630);
        Mat::~Mat((Mat *)0x18dd1a);
        local_5f0 = pfVar2;
        for (local_634 = 0; local_634 < local_3c; local_634 = local_634 + 1) {
          fVar4 = std::plus<float>::operator()(local_29,local_5a0 + local_634,&local_5e4);
          local_5f0[local_634] = fVar4;
        }
      }
      return 0;
    }
  }
  else {
    local_20 = in_RDX;
    if (in_RDI->dims == 2) {
      if (in_RSI->dims == 3) {
        Mat::create(in_stack_fffffffffffff5e0,_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                    (Allocator *)in_stack_fffffffffffff5c0);
        bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
        if (!bVar1) {
          for (local_638 = 0; local_638 < local_54; local_638 = local_638 + 1) {
            local_640 = Mat::row(local_10,local_638);
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_688);
            Mat::~Mat((Mat *)0x18df16);
            local_648 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_6d0);
            Mat::~Mat((Mat *)0x18df68);
            local_690 = pfVar2;
            for (local_6d4 = 0; local_6d4 < local_50; local_6d4 = local_6d4 + 1) {
              local_6d8 = local_640[local_6d4];
              for (local_6dc = 0; local_6dc < local_4c; local_6dc = local_6dc + 1) {
                fVar4 = std::plus<float>::operator()(local_29,&local_6d8,local_648 + local_6dc);
                local_690[local_6dc] = fVar4;
              }
              local_648 = local_648 + local_4c;
              local_690 = local_690 + local_4c;
            }
          }
          return 0;
        }
        return -100;
      }
      Mat::create(in_stack_fffffffffffff5e0,_w,_h,in_stack_fffffffffffff5d0,
                  (Allocator *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
      if (bVar1) {
        return -100;
      }
      if (local_18->dims == 2) {
        for (local_6e0 = 0; local_6e0 < local_3c; local_6e0 = local_6e0 + 1) {
          pfVar2 = Mat::operator[](local_10,(long)local_6e0);
          pfVar3 = Mat::operator[](local_18,(long)local_6e0);
          fVar4 = std::plus<float>::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,(long)local_6e0);
          *pfVar2 = fVar4;
        }
        return 0;
      }
      if (local_18->dims == 1) {
        Mat::create(in_stack_fffffffffffff5e0,(int)((ulong)in_stack_fffffffffffff5d8 >> 0x20),
                    (int)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
        bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_6e4 = *pfVar2;
          for (local_6e8 = 0; local_6e8 < local_3c; local_6e8 = local_6e8 + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_6e8);
            fVar4 = std::plus<float>::operator()(local_29,pfVar2,&local_6e4);
            pfVar2 = Mat::operator[](local_20,(long)local_6e8);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        local_6f0 = Mat::operator_cast_to_float_(local_10);
        local_6f8 = Mat::operator_cast_to_float_(local_20);
        for (local_6fc = 0; local_6fc < local_34; local_6fc = local_6fc + 1) {
          pfVar2 = Mat::operator[](local_18,(long)local_6fc);
          local_700 = *pfVar2;
          for (local_704 = 0; local_704 < local_30; local_704 = local_704 + 1) {
            fVar4 = std::plus<float>::operator()(local_29,local_6f0 + local_704,&local_700);
            local_6f8[local_704] = fVar4;
          }
          local_6f0 = local_6f0 + local_30;
          local_6f8 = local_6f8 + local_30;
        }
        return 0;
      }
    }
    else if (in_RDI->dims == 1) {
      if (in_RDI->w == 1) {
        if (in_RSI->dims == 3) {
          Mat::create(in_stack_fffffffffffff5e0,_w,_h,_c,
                      CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                      (Allocator *)in_stack_fffffffffffff5c0);
          bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_708 = *pfVar2;
            for (local_70c = 0; local_70c < local_54; local_70c = local_70c + 1) {
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                           (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_758);
              Mat::~Mat((Mat *)0x18e578);
              local_718 = pfVar2;
              Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                           (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
              pfVar2 = Mat::operator_cast_to_float_(&local_7a0);
              Mat::~Mat((Mat *)0x18e5c4);
              local_760 = pfVar2;
              for (local_7a4 = 0; local_7a4 < local_58; local_7a4 = local_7a4 + 1) {
                fVar4 = std::plus<float>::operator()(local_29,&local_708,local_718 + local_7a4);
                local_760[local_7a4] = fVar4;
              }
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 2) {
          Mat::create(in_stack_fffffffffffff5e0,_w,_h,in_stack_fffffffffffff5d0,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
          bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_7a8 = *pfVar2;
            for (local_7ac = 0; local_7ac < local_58; local_7ac = local_7ac + 1) {
              pfVar2 = Mat::operator[](local_18,(long)local_7ac);
              fVar4 = std::plus<float>::operator()(local_29,&local_7a8,pfVar2);
              pfVar2 = Mat::operator[](local_20,(long)local_7ac);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
        if (in_RSI->dims == 1) {
          Mat::create(in_stack_fffffffffffff5e0,_w,in_stack_fffffffffffff5d0,
                      (Allocator *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
          bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
          if (!bVar1) {
            pfVar2 = Mat::operator[](local_10,0);
            local_7b0 = *pfVar2;
            for (local_7b4 = 0; local_7b4 < local_4c; local_7b4 = local_7b4 + 1) {
              pfVar2 = Mat::operator[](local_18,(long)local_7b4);
              fVar4 = std::plus<float>::operator()(local_29,&local_7b0,pfVar2);
              pfVar2 = Mat::operator[](local_20,(long)local_7b4);
              *pfVar2 = fVar4;
            }
            return 0;
          }
          return -100;
        }
      }
      if (in_RSI->dims == 3) {
        Mat::create(in_stack_fffffffffffff5e0,_w,_h,_c,
                    CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                    (Allocator *)in_stack_fffffffffffff5c0);
        bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
        if (!bVar1) {
          for (local_7b8 = 0; local_7b8 < local_54; local_7b8 = local_7b8 + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_7b8);
            local_7bc = *pfVar2;
            pMVar5 = &local_808;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(pMVar5);
            Mat::~Mat((Mat *)0x18e9c2);
            pMVar5 = &local_850;
            local_7c8 = pfVar2;
            Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                         (int)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(pMVar5);
            Mat::~Mat((Mat *)0x18ea0e);
            local_810 = pfVar2;
            for (local_854 = 0; local_854 < local_58; local_854 = local_854 + 1) {
              fVar4 = std::plus<float>::operator()(local_29,&local_7bc,local_7c8 + local_854);
              local_810[local_854] = fVar4;
            }
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 2) {
        Mat::create(in_stack_fffffffffffff5e0,_w,_h,in_stack_fffffffffffff5d0,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
        bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
        if (!bVar1) {
          local_860 = Mat::operator_cast_to_float_(local_18);
          local_868 = Mat::operator_cast_to_float_(local_20);
          for (local_86c = 0; local_86c < local_50; local_86c = local_86c + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_86c);
            local_870 = *pfVar2;
            for (local_874 = 0; local_874 < local_4c; local_874 = local_874 + 1) {
              fVar4 = std::plus<float>::operator()(local_29,&local_870,local_860 + local_874);
              local_868[local_874] = fVar4;
            }
            local_860 = local_860 + local_4c;
            local_868 = local_868 + local_4c;
          }
          return 0;
        }
        return -100;
      }
      if (in_RSI->dims == 1) {
        Mat::create(in_stack_fffffffffffff5e0,_w,in_stack_fffffffffffff5d0,
                    (Allocator *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
        bVar1 = Mat::empty(in_stack_fffffffffffff5c0);
        if (bVar1) {
          return -100;
        }
        if (local_18->w == 1) {
          pfVar2 = Mat::operator[](local_18,0);
          local_878 = *pfVar2;
          for (local_87c = 0; local_87c < local_30; local_87c = local_87c + 1) {
            pfVar2 = Mat::operator[](local_10,(long)local_87c);
            fVar4 = std::plus<float>::operator()(local_29,pfVar2,&local_878);
            pfVar2 = Mat::operator[](local_20,(long)local_87c);
            *pfVar2 = fVar4;
          }
          return 0;
        }
        for (local_880 = 0; local_880 < local_30; local_880 = local_880 + 1) {
          pfVar2 = Mat::operator[](local_10,(long)local_880);
          pfVar3 = Mat::operator[](local_18,(long)local_880);
          fVar4 = std::plus<float>::operator()(local_29,pfVar2,pfVar3);
          pfVar2 = Mat::operator[](local_20,(long)local_880);
          *pfVar2 = fVar4;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;
    size_t elemsize = a.elemsize;

    int w1 = b.w;
    int h1 = b.h;
    int channels1 = b.c;
    int size1 = w1 * h1;

    if (a.dims == 3)
    {
        if (b.dims == 3)
        {
            if (w1 == 1 && h1 == 1 && channels1 == channels)
            {
                // special type 1
                c.create(w, h, channels, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* b0 = b.channel(q);
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], b0[0]);
                    }
                }

                return 0;
            }

            if (w1 == w && h1 == h && channels1 == 1)
            {
                // special type 2
                c.create(w, h, channels, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = a.channel(q);
                    const float* ptr1 = b;
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = op(ptr[i], ptr1[i]);
                    }
                }

                return 0;
            }

            if (w == 1 && h == 1 && channels1 == channels)
            {
                // special type 3
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* a0 = a.channel(q);
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size1; i++)
                    {
                        outptr[i] = op(a0[0], ptr1[i]);
                    }
                }

                return 0;
            }

            if (w1 == w && h1 == h && channels == 1)
            {
                // special type 4
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels1; q++)
                {
                    const float* ptr = a;
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);
                    for (int i = 0; i < size1; i++)
                    {
                        outptr[i] = op(ptr[i], ptr1[i]);
                    }
                }

                return 0;
            }

            // type 19
            c.create(w, h, channels, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], ptr1[i]);
                }
            }

            return 0;
        }

        c.create(w, h, channels, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 2)
        {
            // type 18
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float* ptr1 = b.row(q);
                float* outptr = c.channel(q);

                for (int y=0; y<h; y++)
                {
                    const float b0 = ptr1[y];
                    for (int x=0; x<w; x++)
                    {
                        outptr[x] = op(ptr[x], b0);
                    }

                    ptr += w;
                    outptr += w;
                }
            }

            return 0;
        }

        if (b.dims == 1)
        {
            if (b.w == 1)
            {
                // type 16
                const float b0 = b[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = a.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] = op(ptr[i], b0);
                    }
                }

                return 0;
            }

            // type 17
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                const float b0 = b[q];
                float* outptr = c.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = op(ptr[i], b0);
                }
            }

            return 0;
        }
    }
    else if (a.dims == 2)
    {
        if (b.dims == 3)
        {
            // type 14
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels1; q++)
            {
                const float* ptr = a.row(q);
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int y=0; y<h1; y++)
                {
                    const float a0 = ptr[y];
                    for (int x=0; x<w1; x++)
                    {
                        outptr[x] = op(a0, ptr1[x]);
                    }

                    ptr1 += w1;
                    outptr += w1;
                }
            }

            return 0;
        }

        c.create(w, h, elemsize, opt.blob_allocator);
        if (c.empty())
            return -100;

        if (b.dims == 2)
        {
            // type 13
            for (int i=0; i<size; i++)
            {
                c[i] = op(a[i], b[i]);
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, h, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                // type 11
                const float b0 = b[0];
                for (int i=0; i<size; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            // type 12
            const float* ptr = a;
            float* outptr = c;

            for (int y=0; y<h; y++)
            {
                const float b0 = b[y];
                for (int x=0; x<w; x++)
                {
                    outptr[x] = op(ptr[x], b0);
                }

                ptr += w;
                outptr += w;
            }

            return 0;
        }
    }
    else if (a.dims == 1)
    {
        if (a.w == 1)
        {
            if (b.dims == 3)
            {
                // type 4
                c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels1; q++)
                {
                    const float* ptr1 = b.channel(q);
                    float* outptr = c.channel(q);

                    for (int i=0; i<size1; i++)
                    {
                        outptr[i] = op(a0, ptr1[i]);
                    }
                }

                return 0;
            }

            if (b.dims == 2)
            {
                // type 3
                c.create(w1, h1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<size1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }

            if (b.dims == 1)
            {
                // type 2
                c.create(w1, elemsize, opt.blob_allocator);
                if (c.empty())
                    return -100;

                const float a0 = a[0];
                for (int i=0; i<w1; i++)
                {
                    c[i] = op(a0, b[i]);
                }

                return 0;
            }
        }

        if (b.dims == 3)
        {
            // type 9
            c.create(w1, h1, channels1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels1; q++)
            {
                const float a0 = a[q];
                const float* ptr1 = b.channel(q);
                float* outptr = c.channel(q);

                for (int i=0; i<size1; i++)
                {
                    outptr[i] = op(a0, ptr1[i]);
                }
            }

            return 0;
        }

        if (b.dims == 2)
        {
            // type 8
            c.create(w1, h1, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            const float* ptr1 = b;
            float* outptr = c;

            for (int y=0; y<h1; y++)
            {
                const float a0 = a[y];
                for (int x=0; x<w1; x++)
                {
                    outptr[x] = op(a0, ptr1[x]);
                }

                ptr1 += w1;
                outptr += w1;
            }

            return 0;
        }

        if (b.dims == 1)
        {
            c.create(w, elemsize, opt.blob_allocator);
            if (c.empty())
                return -100;

            if (b.w == 1)
            {
                // type 6
                const float b0 = b[0];
                for (int i=0; i<w; i++)
                {
                    c[i] = op(a[i], b0);
                }

                return 0;
            }

            // type 7
            for (int i=0; i<w; i++)
            {
                c[i] = op(a[i], b[i]);
            }
        }
    }

    return 0;
}